

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ReadSymlink(string *newName,string *origName)

{
  ssize_t sVar1;
  uint uVar2;
  char buf [4097];
  char acStack_1018 [4104];
  
  sVar1 = readlink((newName->_M_dataplus)._M_p,acStack_1018,0x1000);
  uVar2 = (uint)sVar1;
  if (-1 < (int)uVar2) {
    acStack_1018[uVar2 & 0x7fffffff] = '\0';
    std::__cxx11::string::assign((char *)origName);
  }
  return -1 < (int)uVar2;
}

Assistant:

bool SystemTools::ReadSymlink(const std::string& newName,
                              std::string& origName)
{
  char buf[KWSYS_SYSTEMTOOLS_MAXPATH+1];
  int count =
    static_cast<int>(readlink(newName.c_str(), buf, KWSYS_SYSTEMTOOLS_MAXPATH));
  if(count >= 0)
    {
    // Add null-terminator.
    buf[count] = 0;
    origName = buf;
    return true;
    }
  else
    {
    return false;
    }
}